

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doIgnoreSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr)

{
  char *s_00;
  int iVar1;
  undefined8 *local_60;
  char **eventEndPP;
  char **eventPP;
  char *s;
  char *pcStack_40;
  int tok;
  char *next;
  char **nextPtr_local;
  char *end_local;
  char **startPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  s_00 = *startPtr;
  if (enc == *(ENCODING **)((long)parser + 0x118)) {
    eventEndPP = (char **)((long)parser + 0x218);
    *eventEndPP = s_00;
    local_60 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    eventEndPP = *(char ***)((long)parser + 0x230);
    local_60 = (undefined8 *)(*(long *)((long)parser + 0x230) + 8);
  }
  *eventEndPP = s_00;
  *startPtr = (char *)0x0;
  next = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = (char *)startPtr;
  startPtr_local = (char **)enc;
  enc_local = (ENCODING *)parser;
  iVar1 = (*enc->scanners[3])(enc,s_00,end,&stack0xffffffffffffffc0);
  *local_60 = pcStack_40;
  switch(iVar1) {
  case 0:
    *eventEndPP = pcStack_40;
    parser_local._4_4_ = XML_ERROR_INVALID_TOKEN;
    break;
  case 0x2a:
    if (enc_local[1].scanners[2] != (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0) {
      reportDefault(enc_local,(ENCODING *)startPtr_local,s_00,pcStack_40);
    }
    *(char **)end_local = pcStack_40;
    parser_local._4_4_ = XML_ERROR_NONE;
    break;
  case -4:
  case -1:
    if (next == (char *)0x0) {
      parser_local._4_4_ = XML_ERROR_SYNTAX;
    }
    else {
      *(char **)next = s_00;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
    break;
  default:
    *eventEndPP = pcStack_40;
    parser_local._4_4_ = XML_ERROR_UNEXPECTED_STATE;
    break;
  case -2:
    if (next == (char *)0x0) {
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
    }
    else {
      *(char **)next = s_00;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static
enum XML_Error doIgnoreSection(XML_Parser parser,
                               const ENCODING *enc,
                               const char **startPtr,
                               const char *end,
                               const char **nextPtr)
{
  const char *next;
  int tok;
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = 0;
  tok = XmlIgnoreSectionTok(enc, s, end, &next);
  *eventEndPP = next;
  switch (tok) {
  case XML_TOK_IGNORE_SECT:
    if (defaultHandler)
      reportDefault(parser, enc, s, next);
    *startPtr = next;
    return XML_ERROR_NONE;
  case XML_TOK_INVALID:
    *eventPP = next;
    return XML_ERROR_INVALID_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (nextPtr) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_PARTIAL_CHAR;
  case XML_TOK_PARTIAL:
  case XML_TOK_NONE:
    if (nextPtr) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_SYNTAX; /* XML_ERROR_UNCLOSED_IGNORE_SECTION */
  default:
    *eventPP = next;
    return XML_ERROR_UNEXPECTED_STATE;
  }
  /* not reached */
}